

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O0

bool server::isPartOf(char *w1,char *w2)

{
  size_t sVar1;
  int local_2c;
  int local_28;
  int i_1;
  int j;
  int i;
  char *w2_local;
  char *w1_local;
  
  local_28 = 0;
  for (; sVar1 = strlen(w1), (ulong)(long)local_2c < sVar1; local_2c = local_2c + 1) {
    if (w1[local_2c] == w2[local_28]) {
      local_28 = local_28 + 1;
    }
  }
  sVar1 = strlen(w2);
  return sVar1 == (long)local_28;
}

Assistant:

bool isPartOf(char* w1, char* w2)
    {
        int i=0;
        int j=0;
        
        for(int i; i < strlen(w1); i++)
        {
            if(w1[i] == w2[j])
            {
                j++;
            }
        }
        
        if(strlen(w2) == j)
            return true;
        else
            return false;
    }